

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputeMetric.cpp
# Opt level: O3

bool __thiscall ComputeMetric::Save(ComputeMetric *this,char *out_file,char *date,char *version)

{
  undefined1 uVar1;
  FILE *__stream;
  int iVar2;
  
  __stream = (FILE *)ithi_file_open(out_file,"w");
  if (__stream == (FILE *)0x0) {
    uVar1 = 0;
  }
  else {
    iVar2 = (*this->_vptr_ComputeMetric[6])(this,__stream,date,version);
    uVar1 = (undefined1)iVar2;
    fclose(__stream);
  }
  return (bool)uVar1;
}

Assistant:

bool ComputeMetric::Save(char const * out_file, char const* date, char const* version)
{
    bool ret;
    FILE * F = NULL;
    
    F = ithi_file_open(out_file, "w");
    ret = (F != NULL);

    if (ret)
    {
        ret = Write(F, date, version);
        fclose(F);
    }

    return ret;
}